

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_empty_result.cpp
# Opt level: O2

void __thiscall
duckdb::LogicalEmptyResult::LogicalEmptyResult
          (LogicalEmptyResult *this,
          unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
          *op)

{
  pointer pLVar1;
  _Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_> local_40;
  
  LogicalOperator::LogicalOperator(&this->super_LogicalOperator,LOGICAL_EMPTY_RESULT);
  (this->super_LogicalOperator)._vptr_LogicalOperator =
       (_func_int **)&PTR__LogicalEmptyResult_027c1968;
  (this->return_types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->return_types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->return_types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->bindings).super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
  super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->bindings).super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
  super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->bindings).super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
  super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pLVar1 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator->(op);
  (*pLVar1->_vptr_LogicalOperator[2])(&local_40,pLVar1);
  ::std::vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>::_M_move_assign
            (&(this->bindings).
              super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>,&local_40)
  ;
  ::std::_Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>::~_Vector_base
            (&local_40);
  pLVar1 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator->(op);
  LogicalOperator::ResolveOperatorTypes(pLVar1);
  pLVar1 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator->(op);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::operator=
            (&(this->return_types).
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
             &(pLVar1->types).
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  return;
}

Assistant:

LogicalEmptyResult::LogicalEmptyResult(unique_ptr<LogicalOperator> op)
    : LogicalOperator(LogicalOperatorType::LOGICAL_EMPTY_RESULT) {

	this->bindings = op->GetColumnBindings();

	op->ResolveOperatorTypes();
	this->return_types = op->types;
}